

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_sseq.c
# Opt level: O2

uint32 * mk_sseq(uint16 *seg,uint32 n_frame,acmod_id_t *phone,uint32 n_phone,model_def_t *mdef)

{
  ushort uVar1;
  uint32 *puVar2;
  uint uVar3;
  ulong uVar4;
  model_def_entry_t *pmVar5;
  
  puVar2 = (uint32 *)
           __ckd_calloc__((ulong)n_frame,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_sseq.c"
                          ,0x45);
  uVar3 = 0xffffffff;
  uVar4 = 0;
  pmVar5 = (model_def_entry_t *)0x0;
  do {
    if (n_frame == uVar4) {
      return puVar2;
    }
    uVar1 = seg[uVar4];
    if ((short)uVar1 < 0) {
      uVar3 = uVar3 + 1;
      if (n_phone <= uVar3) {
        __assert_fail("p < n_phone",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_sseq.c"
                      ,0x52,"uint32 *mk_sseq(uint16 *, uint32, acmod_id_t *, uint32, model_def_t *)"
                     );
      }
      pmVar5 = mdef->defn + phone[uVar3];
      uVar1 = uVar1 & 0x7fff;
    }
    puVar2[uVar4] = pmVar5->state[uVar1 % 0x13];
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

uint32 *
mk_sseq(uint16 *seg,
	uint32 n_frame,
	acmod_id_t *phone,
	uint32 n_phone,
	model_def_t *mdef)
{
    uint32 *sseq;
    uint32 f;
    uint32 p;
    model_def_entry_t *defn = NULL;
    uint32 s;
    uint32 n_state = MAX_N_STATE-1;	/* BEWARE: this should not stay */
    uint16 seg_val;

    sseq = ckd_calloc(n_frame, sizeof(uint32));

    p = 0;
    --p;

    for (f = 0; f < n_frame; f++) {
	seg_val = seg[f];

	if (seg_val & 0x8000) {
	    /* reached a phone begin marker */

	    ++p;	/* next phone */

	    assert(p < n_phone);

	    defn = &mdef->defn[phone[p]];

	    seg_val &= 0x7fff;	/* clr phone begin bit */
	}

	s = seg_val % n_state;	/* model state [0..N-1] where N is # of states/model */

	sseq[f] = defn->state[s];
    }

    return sseq;
}